

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O2

void Eigen::internal::
     generic_product_impl<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,-1,1,0,-1,1>const>,1>,Eigen::Matrix<float,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,3>
     ::eval_dynamic<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::internal::assign_op<float,float>>
               (Matrix<float,__1,__1,_0,__1,__1> *dst,
               Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>
               *lhs,Matrix<float,__1,__1,_0,__1,__1> *rhs,assign_op<float,_float> *func)

{
  Scalar actualAlpha;
  
  eval_dynamic_impl<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>,Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::internal::assign_op<float,float>,float>
            ();
  return;
}

Assistant:

static EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
  void eval_dynamic(Dst& dst, const Lhs& lhs, const Rhs& rhs, const Func &func)
  {
    enum {
      HasScalarFactor = blas_traits<Lhs>::HasScalarFactor || blas_traits<Rhs>::HasScalarFactor,
      ConjLhs = blas_traits<Lhs>::NeedToConjugate,
      ConjRhs = blas_traits<Rhs>::NeedToConjugate
    };
    // FIXME: in c++11 this should be auto, and extractScalarFactor should also return auto
    //        this is important for real*complex_mat
    Scalar actualAlpha = combine_scalar_factors<Scalar>(lhs, rhs);

    eval_dynamic_impl(dst,
                      blas_traits<Lhs>::extract(lhs).template conjugateIf<ConjLhs>(),
                      blas_traits<Rhs>::extract(rhs).template conjugateIf<ConjRhs>(),
                      func,
                      actualAlpha,
                      typename conditional<HasScalarFactor,true_type,false_type>::type());
  }